

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

bool __thiscall VulkanHppGenerator::isHandleTypeByStructure(VulkanHppGenerator *this,string *type)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  const_iterator cVar3;
  VulkanHppGenerator *this_00;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
          ::find(&(this->m_structs)._M_t,type);
  p_Var1 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    local_50._M_p = (pointer)&stack0xffffffffffffffc0;
    this_00 = (VulkanHppGenerator *)&stack0xffffffffffffffb0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffb0,"");
    bVar2 = describesVector(this_00,(StructureData *)(cVar3._M_node + 2),
                            (string *)&stack0xffffffffffffffb0);
    if (bVar2) {
      bVar2 = isHandleType(this,(string *)&cVar3._M_node[3]._M_right[0x28]._M_parent);
      goto LAB_0016586f;
    }
  }
  bVar2 = false;
LAB_0016586f:
  if (((_Rb_tree_header *)cVar3._M_node != p_Var1) &&
     (local_50._M_p != (pointer)&stack0xffffffffffffffc0)) {
    operator_delete(local_50._M_p,local_40 + 1);
  }
  return bVar2;
}

Assistant:

bool VulkanHppGenerator::isHandleTypeByStructure( std::string const & type ) const
{
  auto structIt = m_structs.find( type );
  return ( structIt != m_structs.end() ) && describesVector( structIt->second ) && isHandleType( structIt->second.members[3].type.type );
}